

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

void __thiscall Graph::auxDefineFlows(Graph *this,Vertex *v,Vertex *v_previous)

{
  Vertex *v_00;
  Vertex *pVVar1;
  ostream *poVar2;
  Edge **ppEVar3;
  Edge *pEVar4;
  
  if (v == (Vertex *)0x0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"\n No NULL \n");
    std::endl<char,std::char_traits<char>>(poVar2);
    return;
  }
  ppEVar3 = &v->edgesList;
  do {
    pEVar4 = *ppEVar3;
    if (pEVar4 == (Edge *)0x0) {
      return;
    }
    while( true ) {
      if (pEVar4 == (Edge *)0x0) {
        return;
      }
      v_00 = pEVar4->destiny;
      pVVar1 = v_00;
      if ((pEVar4->closed == true) && (pVVar1 = v_previous, v_00 != v_previous)) break;
      pEVar4->activePowerFlow = 0.0;
      pEVar4->reactivePowerFlow = 0.0;
      pEVar4->activeLoss = 0.0;
      pEVar4->reactiveLoss = 0.0;
      if (pVVar1 == v_previous) {
        pEVar4->closed = false;
      }
      pEVar4 = pEVar4->nextEdge;
    }
    auxDefineFlows(this,v_00,v);
    ppEVar3 = &pEVar4->nextEdge;
  } while( true );
}

Assistant:

void Graph::auxDefineFlows(Vertex *v, Vertex *v_previous){
    if(v == NULL)
        cout<<"\n No NULL \n"<<endl;
    else{
        for(Edge *e= v->getEdgesList(); e!=NULL; e= e->getNext()){

            //nao descer por arcos com chave aberta e descer no sentido correto
            //e->getNoDestino()==v e o arco de volta do arco 'a' assim nao passamos por ele
            while(e!=NULL && (e->isClosed() == false || e->getDestiny()==v_previous) ){

                //nao tem fluxo nem perda em arcos abertos
                e->setActiveFlow(0.0);
                e->setReactiveFlow(0.0);
                e->setActiveLoss(0.0);
                e->setReactiveLoss(0.0);

                if(e->getDestiny()==v_previous)
                    e->setSwitch(false);

                e = e->getNext();
            }
            if(e==NULL)     break;

            auxDefineFlows(e->getDestiny(), v);
        }
    }
}